

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestFactory<roundTripString_rtripconversions_Test>::
~ParameterizedTestFactory(ParameterizedTestFactory<roundTripString_rtripconversions_Test> *this)

{
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_001b3e08;
  std::__cxx11::string::~string((string *)&this->parameter_);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter)
      : parameter_(parameter) {}